

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O2

Error __thiscall
asmjit::v1_14::BaseBuilder::newEmbedDataNode
          (BaseBuilder *this,EmbedDataNode **out,TypeId typeId,void *data,size_t itemCount,
          size_t repeatCount)

{
  EmbedDataNode EVar1;
  undefined1 auVar2 [16];
  EmbedDataNode **ppEVar3;
  char cVar4;
  Error EVar5;
  ulong size;
  EmbedDataNode *__dest;
  Error EStack_50;
  EmbedDataNode *node;
  void *local_40;
  EmbedDataNode **local_38;
  
  *out = (EmbedDataNode *)0x0;
  cVar4 = (((this->super_BaseEmitter)._environment._arch & k32BitMask) == kUnknown) * '\x02' +
          '\x06';
  if ((typeId & 0xfe) != _kBaseStart) {
    cVar4 = '\0';
  }
  if ((byte)((cVar4 + typeId) - 0x20) < 0x45) {
    EVar1 = *(EmbedDataNode *)(TypeUtils::_typeData + (ulong)(byte)(cVar4 + typeId) + 0x100);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = itemCount;
    auVar2 = auVar2 * ZEXT116((byte)EVar1);
    size = auVar2._0_8_;
    if (auVar2._8_8_ == 0) {
      local_40 = data;
      local_38 = out;
      EVar5 = _newNodeT<asmjit::v1_14::EmbedDataNode>(this,&node);
      if (EVar5 == 0) {
        node[0x12] = (EmbedDataNode)typeId;
        node[0x13] = EVar1;
        *(size_t *)(node + 0x30) = itemCount;
        *(size_t *)(node + 0x38) = repeatCount;
        if (size < 0x41) {
          __dest = node + 0x40;
        }
        else {
          __dest = (EmbedDataNode *)Zone::alloc(&this->_dataZone,size,8);
          if (__dest == (EmbedDataNode *)0x0) {
            EVar5 = BaseEmitter::reportError(&this->super_BaseEmitter,1,(char *)0x0);
            return EVar5;
          }
          *(EmbedDataNode **)(node + 0x40) = __dest;
        }
        ppEVar3 = local_38;
        if (local_40 != (void *)0x0) {
          memcpy(__dest,local_40,size);
        }
        *ppEVar3 = node;
        EVar5 = 0;
      }
      return EVar5;
    }
    EStack_50 = 1;
  }
  else {
    EStack_50 = 2;
  }
  EVar5 = BaseEmitter::reportError(&this->super_BaseEmitter,EStack_50,(char *)0x0);
  return EVar5;
}

Assistant:

Error BaseBuilder::newEmbedDataNode(EmbedDataNode** out, TypeId typeId, const void* data, size_t itemCount, size_t repeatCount) {
  *out = nullptr;

  uint32_t deabstractDelta = TypeUtils::deabstractDeltaOfSize(registerSize());
  TypeId finalTypeId = TypeUtils::deabstract(typeId, deabstractDelta);

  if (ASMJIT_UNLIKELY(!TypeUtils::isValid(finalTypeId)))
    return reportError(DebugUtils::errored(kErrorInvalidArgument));

  uint32_t typeSize = TypeUtils::sizeOf(finalTypeId);
  Support::FastUInt8 of = 0;

  size_t dataSize = Support::mulOverflow(itemCount, size_t(typeSize), &of);
  if (ASMJIT_UNLIKELY(of))
    return reportError(DebugUtils::errored(kErrorOutOfMemory));

  EmbedDataNode* node;
  ASMJIT_PROPAGATE(_newNodeT<EmbedDataNode>(&node));

  node->_embed._typeId = typeId;
  node->_embed._typeSize = uint8_t(typeSize);
  node->_itemCount = itemCount;
  node->_repeatCount = repeatCount;

  uint8_t* dstData = node->_inlineData;
  if (dataSize > EmbedDataNode::kInlineBufferSize) {
    dstData = static_cast<uint8_t*>(_dataZone.alloc(dataSize, 8));
    if (ASMJIT_UNLIKELY(!dstData))
      return reportError(DebugUtils::errored(kErrorOutOfMemory));
    node->_externalData = dstData;
  }

  if (data)
    memcpy(dstData, data, dataSize);

  *out = node;
  return kErrorOk;
}